

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O3

int target_data_end(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,int64_t *arg_sizes
                   ,int64_t *arg_types)

{
  ulong uVar1;
  undefined8 *HstPtrBegin;
  ulong uVar2;
  undefined8 *puVar3;
  byte bVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  iterator __position;
  uint uVar8;
  DeviceTy *pDVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  bool IsLast;
  bool local_75;
  uint local_74;
  DeviceTy *local_70;
  void **local_68;
  int64_t *local_60;
  pthread_mutex_t *local_58;
  void **local_50;
  _Base_ptr local_48;
  ulong local_40;
  _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
  *local_38;
  
  if (arg_num < 1) {
    local_74 = 0;
  }
  else {
    local_58 = (pthread_mutex_t *)&Device->ShadowMtx;
    local_38 = (_Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                *)&Device->ShadowPtrMap;
    local_48 = &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_74 = 0;
    uVar10 = (ulong)(uint)arg_num;
    local_70 = Device;
    local_68 = args;
    local_60 = arg_sizes;
    local_50 = args_base;
    do {
      uVar1 = uVar10 - 1;
      local_40 = arg_sizes[uVar10 - 1];
      uVar8 = (uint)local_40;
      if ((local_40 & 0x180) == 0) {
        HstPtrBegin = (undefined8 *)local_50[uVar1];
        pvVar6 = DeviceTy::getTgtPtrBegin
                           (Device,HstPtrBegin,(int64_t)local_68[uVar1],&local_75,
                            (bool)((byte)((uVar8 & 0x10) >> 4) | local_40 < 0x1000000000000));
        uVar2 = arg_sizes[uVar1];
        bVar4 = (byte)(((uint)uVar2 & 0x10) >> 4) | uVar2 < 0x1000000000000;
        bVar11 = ((byte)((uVar8 & 8) >> 3) | local_75) & bVar4;
        if (((uVar2 & 2) != 0) || (Device = local_70, bVar11 != 0)) {
          pDVar9 = local_70;
          if ((uVar2 & 2) != 0) {
            if (bVar4 == 0) {
              lVar7 = DeviceTy::getMapEntryRefCnt
                                (local_70,local_50[(long)(uVar2 - 0x1000000000000) >> 0x30]);
              bVar12 = lVar7 == 1;
            }
            else {
              bVar12 = false;
            }
            pDVar9 = local_70;
            if ((byte)((byte)(((uint)uVar2 & 4) >> 2) | bVar12 | bVar11) == 1) {
              iVar5 = (*(code *)local_70->RTL->data_retrieve)
                                (local_70->RTLDeviceID,HstPtrBegin,pvVar6,local_68[uVar1]);
              local_74 = local_74 | -(uint)(iVar5 != 0);
            }
          }
          pvVar6 = local_68[uVar1];
          iVar5 = pthread_mutex_lock(local_58);
          if (iVar5 != 0) {
            std::__throw_system_error(iVar5);
          }
          __position._M_node =
               (pDVar9->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (__position._M_node != local_48) {
            do {
              puVar3 = *(undefined8 **)(__position._M_node + 1);
              if (HstPtrBegin <= puVar3) {
                if ((undefined8 *)((long)pvVar6 + (long)HstPtrBegin) <= puVar3) break;
                if ((*(byte *)(local_60 + uVar1) & 2) != 0) {
                  *puVar3 = __position._M_node[1]._M_parent;
                }
                if (bVar11 != 0) {
                  std::
                  _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                  ::erase_abi_cxx11_(local_38,__position);
                }
              }
              __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            } while (__position._M_node != local_48);
          }
          pthread_mutex_unlock(local_58);
          Device = local_70;
          arg_sizes = local_60;
          if (bVar11 != 0) {
            iVar5 = DeviceTy::deallocTgtPtr
                              (local_70,HstPtrBegin,(int64_t)local_68[uVar1],
                               SUB41(((uint)local_40 & 8) >> 3,0));
            local_74 = local_74 | -(uint)(iVar5 != 0);
            arg_sizes = local_60;
          }
        }
      }
      bVar12 = 1 < (long)uVar10;
      uVar10 = uVar1;
    } while (bVar12);
  }
  return local_74;
}

Assistant:

static int target_data_end(DeviceTy &Device, int32_t arg_num, void **args_base,
    void **args, int64_t *arg_sizes, int64_t *arg_types) {
  int rc = OFFLOAD_SUCCESS;
  // process each input.
  for (int32_t i = arg_num - 1; i >= 0; --i) {
    // Ignore private variables and arrays - there is no mapping for them.
    // Also, ignore the use_device_ptr directive, it has no effect here.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    bool IsLast;
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ);
    bool ForceDelete = arg_types[i] & OMP_TGT_MAPTYPE_DELETE;

    // If PTR_AND_OBJ, HstPtrBegin is address of pointee
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, arg_sizes[i], IsLast,
        UpdateRef);
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s last\n", arg_sizes[i], DPxPTR(TgtPtrBegin),
        (IsLast ? "" : " not"));

    bool DelEntry = IsLast || ForceDelete;

    if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
        !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
      DelEntry = false; // protect parent struct from being deallocated
    }

    if ((arg_types[i] & OMP_TGT_MAPTYPE_FROM) || DelEntry) {
      // Move data back to the host
      if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
        bool Always = arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS;
        bool CopyMember = false;
        if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
            !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
          // Copy data only if the "parent" struct has RefCount==1.
          short parent_idx = member_of(arg_types[i]);
          long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
          assert(parent_rc > 0 && "parent struct not found");
          if (parent_rc == 1) {
            CopyMember = true;
          }
        }

        if (DelEntry || Always || CopyMember) {
          DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
              arg_sizes[i], DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
          int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, arg_sizes[i]);
          if (rt != OFFLOAD_SUCCESS) {
            DP("Copying data from device failed.\n");
            rc = OFFLOAD_FAIL;
          }
        }
      }

      // If we copied back to the host a struct/array containing pointers, we
      // need to restore the original host pointer values from their shadow
      // copies. If the struct is going to be deallocated, remove any remaining
      // shadow pointer entries for this struct.
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + arg_sizes[i];
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;

        // An STL map is sorted on its keys; use this property
        // to quickly determine when to break out of the loop.
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;

        // If we copied the struct to the host, we need to restore the pointer.
        if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
          DP("Restoring original host pointer value " DPxMOD " for host "
              "pointer " DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
              DPxPTR(ShadowHstPtrAddr));
          *ShadowHstPtrAddr = it->second.HstPtrVal;
        }
        // If the struct is to be deallocated, remove the shadow entry.
        if (DelEntry) {
          DP("Removing shadow pointer " DPxMOD "\n", DPxPTR(ShadowHstPtrAddr));
          Device.ShadowPtrMap.erase(it);
        }
      }
      Device.ShadowMtx.unlock();

      // Deallocate map
      if (DelEntry) {
        int rt = Device.deallocTgtPtr(HstPtrBegin, arg_sizes[i], ForceDelete);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Deallocating data from device failed.\n");
          rc = OFFLOAD_FAIL;
        }
      }
    }
  }

  return rc;
}